

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall util::format<char_const*>(string *__return_storage_ptr__,util *this,char *arg)

{
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,(char *)this,&local_71);
  std::__cxx11::string::string((string *)&local_50,local_30);
  format_abi_cxx11_();
  std::operator+(__return_storage_ptr__,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string format(T arg, Args&&... args)
{
    using namespace std; // pull in to_string for other types
    std::string s = to_string(arg) + format(std::forward<Args>(args)...);
    return s;
}